

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void prf_node_destroy(prf_node_t *node)

{
  if (node != (prf_node_t *)0x0) {
    free(node->data);
    if (node->children != (prf_node_t **)0x0) {
      prf_array_free(node->children);
    }
    free(node);
    return;
  }
  return;
}

Assistant:

void
prf_node_destroy(
    prf_node_t * node )
{
    if ( node != NULL ) {
        if ( node->data )
            free( node->data );
        if ( node->children )
            prf_array_free( node->children );
        free( node );
    }
}